

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O2

void __thiscall kj::Exception::Exception(Exception *this,Exception *other)

{
  Context *orig;
  Type TVar1;
  uint uVar2;
  char *pcVar3;
  char *local_38;
  size_t sStack_30;
  Array<char> local_28;
  
  (this->ownFile).content.disposer = (ArrayDisposer *)0x0;
  (this->ownFile).content.ptr = (char *)0x0;
  (this->ownFile).content.size_ = 0;
  this->file = other->file;
  TVar1 = other->type;
  this->line = other->line;
  this->type = TVar1;
  heapString(&this->description,&other->description);
  (this->context).ptr.disposer = (Disposer *)0x0;
  (this->context).ptr.ptr = (Context *)0x0;
  uVar2 = other->traceCount;
  this->traceCount = uVar2;
  if ((other->ownFile).content.size_ == 0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = (other->ownFile).content.ptr;
  }
  if (this->file == pcVar3) {
    heapString((String *)&local_28,&other->ownFile);
    Array<char>::operator=((Array<char> *)this,&local_28);
    Array<char>::~Array(&local_28);
    if ((this->ownFile).content.size_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (this->ownFile).content.ptr;
    }
    this->file = pcVar3;
    uVar2 = this->traceCount;
  }
  memcpy(this->trace,other->trace,(ulong)uVar2 << 3);
  orig = (other->context).ptr.ptr;
  if (orig != (Context *)0x0) {
    heap<kj::Exception::Context_const&>((kj *)&local_38,orig);
    local_28.ptr = local_38;
    local_28.size_ = sStack_30;
    sStack_30 = 0;
    Own<kj::Exception::Context>::operator=
              (&(this->context).ptr,(Own<kj::Exception::Context> *)&local_28);
    if (local_28.size_ != 0) {
      local_28.size_ = 0;
      (*(code *)**(undefined8 **)local_28.ptr)();
    }
    if (sStack_30 != 0) {
      sStack_30 = 0;
      (*(code *)**(undefined8 **)local_38)();
    }
  }
  return;
}

Assistant:

Exception::Exception(const Exception& other) noexcept
    : file(other.file), line(other.line), type(other.type),
      description(heapString(other.description)), traceCount(other.traceCount) {
  if (file == other.ownFile.cStr()) {
    ownFile = heapString(other.ownFile);
    file = ownFile.cStr();
  }

  memcpy(trace, other.trace, sizeof(trace[0]) * traceCount);

  KJ_IF_MAYBE(c, other.context) {
    context = heap(**c);
  }
}